

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O2

void SQCompilation::SQCompilationContext::resetConfig(void)

{
  long lVar1;
  allocator<char> local_2c4;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  allocator<char> local_2c0;
  allocator<char> local_2bf;
  allocator<char> local_2be;
  allocator<char> local_2bd;
  allocator<char> local_2bc;
  allocator<char> local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  allocator<char> local_2b8;
  allocator<char> local_2b7;
  allocator<char> local_2b6;
  allocator<char> local_2b5;
  allocator<char> local_2b4;
  allocator<char> local_2b3;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)function_forbidden_abi_cxx11_,
              (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )ZEXT816(0));
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"prn",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"print",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"form",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"fmt",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"log",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"dbg",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"assert",&local_2c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &format_function_name_abi_cxx11_,local_2b0,local_1d0);
  lVar1 = 0xc0;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"subst",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"concat",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"tostring",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"toupper",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"tolower",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"slice",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"trim",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"join",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"format",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"replace",&local_2bc);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_can_return_string_abi_cxx11_,local_2b0,local_170);
  lVar1 = 0x120;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"has",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"Has",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"have",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"Have",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"should",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"Should",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"need",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"Need",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"is",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Is",&local_2bc);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"was",&local_2ba);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"Was",&local_2b9);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"will",&local_2b3);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"Will",&local_2b4);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"contains",&local_2b5);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"match",&local_2b6);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"startswith",&local_2b7);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"endswith",&local_2b8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_should_return_bool_prefix_abi_cxx11_,local_2b0,local_70);
  lVar1 = 0x220;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"get",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"Get",&local_2c3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_should_return_something_prefix_abi_cxx11_,local_2b0,local_270);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"__merge",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"indexof",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"findindex",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"findvalue",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"len",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"reduce",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"tostring",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"tointeger",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"tofloat",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"slice",&local_2bc);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"tolower",&local_2ba);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"toupper",&local_2b9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_result_must_be_utilized_abi_cxx11_,local_2b0,local_130);
  lVar1 = 0x160;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"indexof",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"findindex",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"findvalue",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"require_optional",&local_2c1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_can_return_null_abi_cxx11_,local_2b0,local_230);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"findvalue",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"findindex",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"filter",&local_2c2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_takes_boolean_lambda_abi_cxx11_,local_2b0,local_250);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"findvalue",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"findindex",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"__update",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"filter",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"map",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"reduce",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"each",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"sort",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"assert",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"persist",&local_2bc);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"join",&local_2ba);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_calls_lambda_inplace_abi_cxx11_,local_2b0,local_150);
  lVar1 = 0x140;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"require",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"require_optional",&local_2c3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_forbidden_parent_dir_abi_cxx11_,local_2b0,local_270);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"extend",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"append",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"__update",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"insert",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"apply",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"clear",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"sort",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"reverse",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"resize",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"rawdelete",&local_2bc);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"rawset",&local_2ba);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"remove",&local_2b9);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_modifies_object_abi_cxx11_,local_2b0,local_130);
  lVar1 = 0x160;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"keepref",&local_2c4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             function_must_be_called_from_root_abi_cxx11_,local_2b0,local_290);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"require",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"require_optional",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"vargv",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"persist",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"getclass",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"__name__",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"__filename__",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"keepref",&local_2bd);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std_identifier_abi_cxx11_,local_2b0,local_1b0);
  lVar1 = 0xe0;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"seterrorhandler",&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"setdebughook",&local_2c3);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"getstackinfos",&local_2c2);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"getroottable",&local_2c1);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"getconsttable",&local_2be);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"getclass",&local_2bf);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"assert",&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"print",&local_2bd);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"error",&local_2bb);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"compilestring",&local_2bc);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"newthread",&local_2ba);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"suspend",&local_2b9);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"array",&local_2b3);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"type",&local_2b4);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"callee",&local_2b5);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"collectgarbage",&local_2b6);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"resurrectunreachable",&local_2b7);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"min",&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"max",&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"clamp",&local_2b2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std_function_abi_cxx11_,local_2b0,&stack0xffffffffffffffd0);
  lVar1 = 0x260;
  do {
    std::__cxx11::string::~string(local_2b0 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void SQCompilationContext::resetConfig() {

  function_forbidden = {

  };

  format_function_name = {
    "prn",
    "print",
    "form",
    "fmt",
    "log",
    "dbg",
    "assert",
  };

  function_can_return_string = {
    "subst",
    "concat",
    "tostring",
    "toupper",
    "tolower",
    "slice",
    "trim",
    "join",
    "format",
    "replace"
  };

  function_should_return_bool_prefix = {
    "has",
    "Has",
    "have",
    "Have",
    "should",
    "Should",
    "need",
    "Need",
    "is",
    "Is",
    "was",
    "Was",
    "will",
    "Will",
    "contains",
    "match",
    "startswith",
    "endswith"
  };

  function_should_return_something_prefix = {
    "get",
    "Get"
  };

  function_result_must_be_utilized = {
    "__merge",
    "indexof",
    "findindex",
    "findvalue",
    "len",
    "reduce",
    "tostring",
    "tointeger",
    "tofloat",
    "slice",
    "tolower",
    "toupper"
  };

  function_can_return_null = {
    "indexof",
    "findindex",
    "findvalue",
    "require_optional"
  };

  function_takes_boolean_lambda = {
    "findvalue",
    "findindex",
    "filter"
  };

  function_calls_lambda_inplace = {
    "findvalue",
    "findindex",
    "__update",
    "filter",
    "map",
    "reduce",
    "each",
    "sort",
    "assert",
    "persist",
    "join",
  };

  function_forbidden_parent_dir = {
    "require",
    "require_optional",
  };

  function_modifies_object = {
    "extend",
    "append",
    "__update",
    "insert",
    "apply",
    "clear",
    "sort",
    "reverse",
    "resize",
    "rawdelete",
    "rawset",
    "remove"
  };

  function_must_be_called_from_root = {
    "keepref"
  };

  std_identifier = {
    "require",
    "require_optional",
    "vargv",
    "persist",
    "getclass",
    "__name__",
    "__filename__",
    "keepref",
  };

  std_function = {
    "seterrorhandler",
    "setdebughook",
    "getstackinfos",
    "getroottable",
    "getconsttable",
    "getclass",
    "assert",
    "print",
    "error",
    "compilestring",
    "newthread",
    "suspend",
    "array",
    "type",
    "callee",
    "collectgarbage",
    "resurrectunreachable",
    "min",
    "max",
    "clamp",
  };

}